

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChQuaternion.cpp
# Opt level: O1

ChQuaternion<double> *
chrono::AngleDT_to_QuatDT
          (ChQuaternion<double> *__return_storage_ptr__,AngleSet angset,ChVector<double> *mangles,
          ChQuaternion<double> *q)

{
  double dVar1;
  double dVar2;
  double dVar3;
  ChVector<double> ang2;
  ChQuaternion<double> local_68;
  undefined1 local_48 [16];
  double local_38;
  
  __return_storage_ptr__->m_data[0] = 0.0;
  __return_storage_ptr__->m_data[1] = 0.0;
  __return_storage_ptr__->m_data[2] = 0.0;
  __return_storage_ptr__->m_data[3] = 0.0;
  local_48 = ZEXT416(0) << 0x40;
  local_38 = 0.0;
  Quat_to_Angle((ChVector<double> *)&local_68,angset,q);
  local_38 = mangles->m_data[2] * 0.0001 + local_68.m_data[2];
  local_48._8_8_ = mangles->m_data[1] * 0.0001 + local_68.m_data[1];
  local_48._0_8_ = mangles->m_data[0] * 0.0001 + local_68.m_data[0];
  Angle_to_Quat(&local_68,angset,(ChVector<double> *)local_48);
  dVar1 = q->m_data[3];
  dVar2 = q->m_data[2];
  dVar3 = q->m_data[1];
  __return_storage_ptr__->m_data[0] = (local_68.m_data[0] - q->m_data[0]) * 10000.0;
  __return_storage_ptr__->m_data[1] = (local_68.m_data[1] - dVar3) * 10000.0;
  __return_storage_ptr__->m_data[2] = (local_68.m_data[2] - dVar2) * 10000.0;
  __return_storage_ptr__->m_data[3] = (local_68.m_data[3] - dVar1) * 10000.0;
  return __return_storage_ptr__;
}

Assistant:

ChQuaternion<double> AngleDT_to_QuatDT(AngleSet angset,
                                       const ChVector<double>& mangles,
                                       const ChQuaternion<double>& q) {
    ChQuaternion<double> res;
    ChQuaternion<double> q2;
    ChVector<double> ang1, ang2;

    ang1 = Quat_to_Angle(angset, q);
    ang2 = Vadd(ang1, Vmul(mangles, BDF_STEP_HIGH));
    q2 = Angle_to_Quat(angset, ang2);
    res = Qscale(Qsub(q2, q), 1 / BDF_STEP_HIGH);

    return res;
}